

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O2

unsigned_long
duckdb::Chimp128Decompression<unsigned_long>::DecompressValue
          (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
          UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  UnpackedData *pUVar1;
  uint8_t uVar2;
  uint uVar3;
  byte bVar4;
  unsigned_long uVar5;
  InternalException *this;
  uint64_t uVar6;
  ulong uVar7;
  undefined7 in_register_00000039;
  allocator local_41;
  string local_40;
  
  uVar7 = CONCAT71(in_register_00000039,flag) & 0xffffffff;
  switch(uVar7) {
  case 0:
    bVar4 = BitReader::ReadValue<unsigned_char,(unsigned_char)7>(&state->input);
    uVar5 = (state->ring_buffer).buffer[bVar4];
    goto LAB_0049752c;
  case 1:
    uVar3 = *unpacked_index;
    *unpacked_index = uVar3 + 1;
    pUVar1 = unpacked_data + uVar3;
    uVar2 = pUVar1->leading_zero;
    state->leading_zeros = uVar2;
    state->trailing_zeros = '@' - (uVar2 + pUVar1->significant_bits);
    uVar5 = BitReader::ReadValue<unsigned_long>(&state->input,&pUVar1->significant_bits);
    uVar5 = uVar5 << (state->trailing_zeros & 0x3f) ^ (state->ring_buffer).buffer[pUVar1->index];
    goto LAB_0049752c;
  case 2:
    uVar2 = state->leading_zeros;
    break;
  case 3:
    uVar3 = *leading_zero_index;
    *leading_zero_index = uVar3 + 1;
    uVar2 = leading_zeros[uVar3];
    state->leading_zeros = uVar2;
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Chimp compression flag with value %d not recognized",&local_41);
    InternalException::InternalException<duckdb::ChimpConstants::Flags>(this,&local_40,(Flags)uVar7)
    ;
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_40._M_dataplus._M_p._0_1_ = '@' - uVar2;
  uVar5 = BitReader::ReadValue<unsigned_long>(&state->input,(uint8_t *)&local_40);
  uVar5 = uVar5 ^ state->reference_value;
LAB_0049752c:
  state->reference_value = uVar5;
  uVar6 = (state->ring_buffer).index + 1;
  (state->ring_buffer).index = uVar6;
  (state->ring_buffer).buffer[(uint)uVar6 & 0x7f] = uVar5;
  return uVar5;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}